

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSBuilder::freeTemp(Wasm2JSBuilder *this,Type type,IString temp)

{
  mapped_type *this_00;
  undefined1 local_20 [8];
  IString temp_local;
  Type type_local;
  
  temp_local.str._M_len = (size_t)temp.str._M_str;
  local_20 = (undefined1  [8])temp.str._M_len;
  temp_local.str._M_str = (char *)type.id;
  if ((type.id & 1) == 0 || type.id < 7) {
    this_00 = std::__detail::
              _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->frees,(key_type *)&temp_local.str._M_str);
    std::vector<wasm::IString,_std::allocator<wasm::IString>_>::push_back
              (this_00,(value_type *)local_20);
    return;
  }
  __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                ,0xe8,"void wasm::Wasm2JSBuilder::freeTemp(Type, IString)");
}

Assistant:

void freeTemp(Type type, IString temp) {
    // TODO: handle tuples
    assert(!type.isTuple() && "Unexpected tuple type");
    frees[type].push_back(temp);
  }